

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::operator+=(BN *this,BN *bn)

{
  pointer puVar1;
  pointer puVar2;
  size_t pos_1;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint local_14;
  
  uVar3 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start >> 1;
  uVar5 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start >> 1;
  if (uVar5 < uVar3) {
    uVar5 = uVar3;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,uVar5);
  puVar1 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar1 >> 1;
  puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = (uint)puVar1[uVar3] + (uint)puVar2[uVar3] + (uVar4 >> 0x10);
    puVar2[uVar3] = (unsigned_short)uVar4;
  }
  puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (; uVar5 < (ulong)((long)puVar1 - (long)puVar2 >> 1); uVar5 = uVar5 + 1) {
    uVar4 = (uVar4 >> 0x10) + (uint)puVar2[uVar5];
    puVar2[uVar5] = (unsigned_short)uVar4;
  }
  if (0xffff < uVar4) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::emplace_back<unsigned_int&>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)this,&local_14);
  }
  return this;
}

Assistant:

BN& BN::operator += (const BN& bn) {
    ba.resize(max(ba.size(), bn.ba.size()));

    bt2 sum = 0;
    for(size_t pos = 0; pos < bn.ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos] + bn.ba[pos];
        ba[pos] = sum;
    }

    for(size_t pos = bn.ba.size(); pos < ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos];
        ba[pos] = sum;
    }
    sum >>= bz8;
    if (sum)
        ba.emplace_back(sum);
    return *this;
}